

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O3

void __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
::~basic_rotating_log
          (basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
           *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int in_ESI;
  
  close(this,in_ESI);
  testing::internal::
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~FunctionMocker(&(this->file_system_traits_).gmock02_rename_34);
  testing::internal::
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~FunctionMocker(&(this->file_system_traits_).gmock01_unlink_33);
  testing::internal::
  FunctionMocker<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~FunctionMocker(&(this->file_system_traits_).gmock01_exists_32);
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~FunctionMocker(&(this->stream_traits_).gmock01_clear_46);
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~FunctionMocker(&(this->stream_traits_).gmock01_close_45);
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  ::~FunctionMocker(&(this->stream_traits_).gmock03_open_44);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->stream_);
  std::ios_base::~ios_base((ios_base *)&this->field_0xf0);
  pcVar1 = (this->base_name_)._M_dataplus._M_p;
  paVar2 = &(this->base_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_basic_logger).super_logger._vptr_logger = (_func_int **)&PTR__basic_logger_002746f8;
  pcVar1 = (this->super_basic_logger).thread_name_._M_dataplus._M_p;
  paVar2 = &(this->super_basic_logger).thread_name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_basic_logger).super_logger._vptr_logger = (_func_int **)&PTR__logger_00274798;
  pcVar1 = (this->super_basic_logger).super_logger.buffer_._M_dataplus._M_p;
  paVar2 = &(this->super_basic_logger).super_logger.buffer_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

basic_rotating_log<StreamTraits, FileSystemTraits>::~basic_rotating_log () noexcept {
        PSTORE_TRY { this->close (); }